

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::dump(Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  int iVar1;
  bool bVar2;
  reference pCVar3;
  char *str;
  size_type sVar4;
  const_reference ppcVar5;
  undefined1 local_1d0 [8];
  Instruction sourceExtInst;
  undefined1 local_168 [4];
  int e;
  Instruction memInst;
  Instruction extInst;
  _Self local_a0;
  iterator it_1;
  Instruction capInst;
  _Self local_30;
  iterator it;
  value_type_conflict local_20;
  value_type_conflict local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  Builder *this_local;
  
  local_18 = out;
  out_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(out,&MagicNumber);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_18,&this->spvVersion);
  local_1c = this->builderNumber;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_18,&local_1c);
  local_20 = this->uniqueId + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_18,&local_20);
  it._M_node._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (local_18,(value_type_conflict *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>::
       cbegin(&this->capabilities);
  while( true ) {
    capInst.block =
         (Block *)std::
                  set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
                  ::cend(&this->capabilities);
    bVar2 = std::operator!=(&local_30,(_Self *)&capInst.block);
    if (!bVar2) break;
    spv::Instruction::Instruction((Instruction *)&it_1,0,0,OpCapability);
    pCVar3 = std::_Rb_tree_const_iterator<spv::Capability>::operator*(&local_30);
    spv::Instruction::addImmediateOperand((Instruction *)&it_1,*pCVar3);
    spv::Instruction::dump((Instruction *)&it_1,local_18);
    spv::Instruction::~Instruction((Instruction *)&it_1);
    std::_Rb_tree_const_iterator<spv::Capability>::operator++(&local_30);
  }
  local_a0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::cbegin(&this->extensions);
  while( true ) {
    extInst.block =
         (Block *)std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::cend(&this->extensions);
    bVar2 = std::operator!=(&local_a0,(_Self *)&extInst.block);
    if (!bVar2) break;
    spv::Instruction::Instruction((Instruction *)&memInst.block,0,0,OpExtension);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->(&local_a0);
    str = (char *)std::__cxx11::string::c_str();
    spv::Instruction::addStringOperand((Instruction *)&memInst.block,str);
    spv::Instruction::dump((Instruction *)&memInst.block,local_18);
    spv::Instruction::~Instruction((Instruction *)&memInst.block);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_a0);
  }
  dumpInstructions<std::vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->imports);
  spv::Instruction::Instruction((Instruction *)local_168,0,0,OpMemoryModel);
  spv::Instruction::addImmediateOperand((Instruction *)local_168,this->addressModel);
  spv::Instruction::addImmediateOperand((Instruction *)local_168,this->memoryModel);
  spv::Instruction::dump((Instruction *)local_168,local_18);
  dumpInstructions<std::vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->entryPoints);
  dumpInstructions<std::vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->executionModes);
  dumpInstructions<std::vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->strings);
  dumpSourceInstructions(this,local_18);
  sourceExtInst.block._4_4_ = 0;
  while( true ) {
    iVar1 = sourceExtInst.block._4_4_;
    sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->sourceExtensions);
    if ((int)sVar4 <= iVar1) break;
    spv::Instruction::Instruction((Instruction *)local_1d0,0,0,OpSourceExtension);
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->sourceExtensions,(long)sourceExtInst.block._4_4_);
    spv::Instruction::addStringOperand((Instruction *)local_1d0,*ppcVar5);
    spv::Instruction::dump((Instruction *)local_1d0,local_18);
    spv::Instruction::~Instruction((Instruction *)local_1d0);
    sourceExtInst.block._4_4_ = sourceExtInst.block._4_4_ + 1;
  }
  dumpInstructions<std::vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->names);
  dumpModuleProcesses(this,local_18);
  dumpInstructions<std::set<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->decorations);
  dumpInstructions<std::vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->constantsTypesGlobals);
  dumpInstructions<std::vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,local_18,&this->externals);
  Module::dump(&this->module,local_18);
  spv::Instruction::~Instruction((Instruction *)local_168);
  return;
}

Assistant:

void Builder::dump(std::vector<unsigned int>& out) const
{
    // Header, before first instructions:
    out.push_back(MagicNumber);
    out.push_back(spvVersion);
    out.push_back(builderNumber);
    out.push_back(uniqueId + 1);
    out.push_back(0);

    // Capabilities
    for (auto it = capabilities.cbegin(); it != capabilities.cend(); ++it) {
        Instruction capInst(0, 0, OpCapability);
        capInst.addImmediateOperand(*it);
        capInst.dump(out);
    }

    for (auto it = extensions.cbegin(); it != extensions.cend(); ++it) {
        Instruction extInst(0, 0, OpExtension);
        extInst.addStringOperand(it->c_str());
        extInst.dump(out);
    }

    dumpInstructions(out, imports);
    Instruction memInst(0, 0, OpMemoryModel);
    memInst.addImmediateOperand(addressModel);
    memInst.addImmediateOperand(memoryModel);
    memInst.dump(out);

    // Instructions saved up while building:
    dumpInstructions(out, entryPoints);
    dumpInstructions(out, executionModes);

    // Debug instructions
    dumpInstructions(out, strings);
    dumpSourceInstructions(out);
    for (int e = 0; e < (int)sourceExtensions.size(); ++e) {
        Instruction sourceExtInst(0, 0, OpSourceExtension);
        sourceExtInst.addStringOperand(sourceExtensions[e]);
        sourceExtInst.dump(out);
    }
    dumpInstructions(out, names);
    dumpModuleProcesses(out);

    // Annotation instructions
    dumpInstructions(out, decorations);

    dumpInstructions(out, constantsTypesGlobals);
    dumpInstructions(out, externals);

    // The functions
    module.dump(out);
}